

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O2

int secp256k1_der_read_len(uchar **sigp,uchar *sigend)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  uint uVar5;
  ulong uVar7;
  ulong uVar8;
  ulong uVar6;
  
  pbVar4 = *sigp;
  iVar3 = -1;
  if (pbVar4 < sigend) {
    pbVar1 = pbVar4 + 1;
    *sigp = pbVar1;
    bVar2 = *pbVar4;
    if (bVar2 != 0xff) {
      if (-1 < (char)bVar2) {
        return (uint)bVar2;
      }
      if (bVar2 != 0x80) {
        uVar5 = bVar2 & 0x7f;
        uVar6 = (ulong)uVar5;
        uVar7 = (long)sigend - (long)pbVar1;
        if ((((long)uVar6 <= (long)uVar7) && (uVar5 < 9)) && (*pbVar1 != 0)) {
          pbVar4 = pbVar4 + 2;
          uVar8 = 0;
          for (; 0 < (int)uVar6; uVar6 = (ulong)((int)uVar6 - 1)) {
            uVar8 = (ulong)pbVar4[-1] | uVar8 << 8;
            if (uVar7 < uVar6 + uVar8) {
              return -1;
            }
            *sigp = pbVar4;
            pbVar4 = pbVar4 + 1;
            uVar7 = uVar7 - 1;
          }
          iVar3 = -1;
          if (0x7f < uVar8) {
            iVar3 = (int)uVar8;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int secp256k1_der_read_len(const unsigned char **sigp, const unsigned char *sigend) {
    int lenleft, b1;
    size_t ret = 0;
    if (*sigp >= sigend) {
        return -1;
    }
    b1 = *((*sigp)++);
    if (b1 == 0xFF) {
        /* X.690-0207 8.1.3.5.c the value 0xFF shall not be used. */
        return -1;
    }
    if ((b1 & 0x80) == 0) {
        /* X.690-0207 8.1.3.4 short form length octets */
        return b1;
    }
    if (b1 == 0x80) {
        /* Indefinite length is not allowed in DER. */
        return -1;
    }
    /* X.690-207 8.1.3.5 long form length octets */
    lenleft = b1 & 0x7F;
    if (lenleft > sigend - *sigp) {
        return -1;
    }
    if (**sigp == 0) {
        /* Not the shortest possible length encoding. */
        return -1;
    }
    if ((size_t)lenleft > sizeof(size_t)) {
        /* The resulting length would exceed the range of a size_t, so
         * certainly longer than the passed array size.
         */
        return -1;
    }
    while (lenleft > 0) {
        ret = (ret << 8) | **sigp;
        if (ret + lenleft > (size_t)(sigend - *sigp)) {
            /* Result exceeds the length of the passed array. */
            return -1;
        }
        (*sigp)++;
        lenleft--;
    }
    if (ret < 128) {
        /* Not the shortest possible length encoding. */
        return -1;
    }
    return ret;
}